

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialNormalizer.cpp
# Opt level: O3

PolyNf * __thiscall
Kernel::RenderPolyNf::operator()
          (PolyNf *__return_storage_ptr__,RenderPolyNf *this,
          PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_> *facs)

{
  RenderMonom local_89;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_88;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_68;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> local_48;
  
  RenderMonom::operator()(&local_48,&local_89,facs);
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
            ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_88,&local_48);
  mpz_clear(local_48.numeral.super_RationalConstantType._den._val);
  mpz_clear((__mpz_struct *)&local_48);
  local_68._capacity = local_88._capacity;
  local_88._capacity = 0;
  local_68._end = local_88._end;
  local_88._end = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
  local_68._stack = local_88._stack;
  local_68._cursor = local_88._cursor;
  local_88._stack = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
  local_88._cursor = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
  operator()(__return_storage_ptr__,this,
             (Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_68);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_68);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_88);
  return __return_storage_ptr__;
}

Assistant:

PolyNf operator()(PreMonom<NumTraits> facs) const
  {
    auto poly = Polynom<NumTraits>(RenderMonom{}(std::move(facs)));
    poly.integrity();
    return (*this)(std::move(poly));
  }